

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebBinder.cpp
# Opt level: O3

string * __thiscall WebBinder::getPath(string *__return_storage_ptr__,WebBinder *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  pointer pcVar4;
  size_type sVar5;
  bool bVar6;
  long *plVar7;
  pointer ppVar8;
  size_type *psVar9;
  size_type *psVar10;
  string *psVar11;
  regex fileRegex;
  string regexString;
  regex dirRegex;
  string local_c8;
  string *local_a8;
  string local_a0;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  pointer local_58;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  ppVar8 = (this->binds).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58 = (this->binds).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_a8 = __return_storage_ptr__;
  if (ppVar8 != local_58) {
    paVar1 = &local_c8.field_2;
    paVar2 = &local_a0.field_2;
    local_60 = &__return_storage_ptr__->field_2;
    psVar10 = &(ppVar8->second)._M_string_length;
    do {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,psVar10[-5],psVar10[-4] + psVar10[-5]);
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"*","");
      psVar11 = &local_a0;
      local_a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"(\\w)+","");
      replaceAll((WebBinder *)psVar11,&local_80,&local_c8,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/","");
      psVar11 = &local_a0;
      local_a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"\\/","");
      replaceAll((WebBinder *)psVar11,&local_80,&local_c8,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_a0,&local_80,0x10);
      _Var3._M_current = (path->_M_dataplus)._M_p;
      local_c8.field_2._M_allocated_capacity = 0;
      local_c8.field_2._8_8_ = 0;
      local_c8._M_dataplus._M_p = (pointer)0x0;
      local_c8._M_string_length = 0;
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(_Var3._M_current + path->_M_string_length),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&local_c8,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_a0,0);
      if (local_c8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_c8._M_dataplus._M_p,
                        local_c8.field_2._M_allocated_capacity - (long)local_c8._M_dataplus._M_p);
      }
      if (bVar6) {
        (local_a8->_M_dataplus)._M_p = (pointer)local_60;
        pcVar4 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (psVar10 + -1))->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>((string *)local_a8,pcVar4,pcVar4 + *psVar10);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p == &local_80.field_2) {
          return local_a8;
        }
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        return local_a8;
      }
      std::__cxx11::string::append((char *)&local_80);
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_50,&local_80,0x10);
      _Var3._M_current = (path->_M_dataplus)._M_p;
      local_c8.field_2._M_allocated_capacity = 0;
      local_c8.field_2._8_8_ = 0;
      local_c8._M_dataplus._M_p = (pointer)0x0;
      local_c8._M_string_length = 0;
      bVar6 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (_Var3,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(_Var3._M_current + path->_M_string_length),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&local_c8,&local_50,0);
      if (local_c8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_c8._M_dataplus._M_p,
                        local_c8.field_2._M_allocated_capacity - (long)local_c8._M_dataplus._M_p);
      }
      if (bVar6) {
        std::__cxx11::string::find_last_of((char *)path,0x130017,0xffffffffffffffff);
        std::__cxx11::string::substr((ulong)&local_c8,(ulong)path);
        plVar7 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_c8,0,(char *)0x0,
                                    (ulong)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(psVar10 + -1))->_M_dataplus)._M_p);
        (local_a8->_M_dataplus)._M_p = (pointer)local_60;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar9) {
          sVar5 = plVar7[3];
          local_60->_M_allocated_capacity = *psVar9;
          *(size_type *)((long)local_60 + 8) = sVar5;
        }
        else {
          (local_a8->_M_dataplus)._M_p = (pointer)*plVar7;
          (local_a8->field_2)._M_allocated_capacity = *psVar9;
        }
        local_a8->_M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        return local_a8;
      }
      ppVar8 = (pointer)(psVar10 + 3);
      psVar10 = psVar10 + 8;
    } while (ppVar8 != local_58);
  }
  (local_a8->_M_dataplus)._M_p = (pointer)&local_a8->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
  return local_a8;
}

Assistant:

std::string WebBinder::getPath(std::string path) {
  
  for (auto &pair : binds) {
    std::string regexString(pair.first);
    replaceAll(regexString, "*", "(\\w)+");
    replaceAll(regexString, "/", "\\/");
    std::regex fileRegex(regexString);
    
    if (std::regex_match(path, fileRegex)) 
      return pair.second;
    
    regexString.append("(\\w)+(\\.(\\w)+)?");
    std::regex dirRegex(regexString);
    if (std::regex_match(path, dirRegex)) 
      return pair.second + path.substr(path.find_last_of("/") + 1, path.length());
  }
  
  return "";
}